

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functors.h
# Opt level: O0

float __thiscall cnn::FBinaryLogLoss::operator()(FBinaryLogLoss *this,float x,float x_true)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  float in_XMM1_Da;
  undefined4 local_14;
  undefined4 local_4;
  
  local_14 = in_XMM0_Da;
  if ((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) {
    if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
      if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
        local_14 = std::numeric_limits<float>::min();
      }
      if ((local_14 == 1.0) && (!NAN(local_14))) {
        local_14 = std::numeric_limits<float>::min();
      }
      dVar1 = std::log((double)(ulong)(uint)local_14);
      dVar2 = std::log1p((double)(ulong)(uint)-local_14);
      local_4 = (in_XMM1_Da * SUB84(dVar1,0) + (1.0 - in_XMM1_Da) * SUB84(dVar2,0)) * -1.0;
    }
    else {
      if ((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) {
        local_14 = std::numeric_limits<float>::min();
      }
      dVar1 = std::log1p((double)(ulong)(uint)-local_14);
      local_4 = (in_XMM1_Da - 1.0) * SUB84(dVar1,0);
    }
  }
  else {
    if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
      local_14 = std::numeric_limits<float>::min();
    }
    dVar1 = std::log((double)(ulong)(uint)local_14);
    local_4 = in_XMM1_Da * -1.0 * SUB84(dVar1,0);
  }
  return local_4;
}

Assistant:

CNN_DEVICE_FUNC inline float operator()(float x, float x_true) const {
    if (x_true == 1.f) {
      if (x == 0.f) x = CNN_DEVICE_MIN;
      return -1.f * x_true * log(x);
    }
    else if (x_true == 0.f) {
      if (x == 1.f) x = CNN_DEVICE_MIN;
      return (x_true - 1.f) * log1p(-x);
    }
    else {
      if (x == 0.f) x = CNN_DEVICE_MIN;
      if (x == 1.f) x = CNN_DEVICE_MIN;
      return -1.f * (x_true * log(x) + (1.f - x_true) * log1p(-x));
    }
  }